

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassBase.hpp
# Opt level: O2

void __thiscall
Diligent::RenderPassBase<Diligent::SerializationEngineImplTraits>::Destruct
          (RenderPassBase<Diligent::SerializationEngineImplTraits> *this)

{
  string msg;
  
  if (this->m_IsDestructed == true) {
    FormatString<char[40]>(&msg,(char (*) [40])"This object has already been destructed");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Destruct",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/RenderPassBase.hpp"
               ,0x78);
    std::__cxx11::string::~string((string *)&msg);
  }
  std::__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::reset
            ((__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
             &this->m_pRawMemory,(pointer)0x0);
  this->m_AttachmentStates = (RESOURCE_STATE *)0x0;
  this->m_AttachmentFirstLastUse = (pair<unsigned_int,_unsigned_int> *)0x0;
  this->m_IsDestructed = true;
  return;
}

Assistant:

void Destruct()
    {
        VERIFY(!m_IsDestructed, "This object has already been destructed");

        m_pRawMemory.reset();

        m_AttachmentStates       = nullptr;
        m_AttachmentFirstLastUse = nullptr;

#if DILIGENT_DEBUG
        m_IsDestructed = true;
#endif
    }